

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSceneMeshMSFT *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *pvVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0 [32];
  ostringstream local_3c0 [8];
  ostringstream oss_supportsIndicesUint16;
  string local_248 [8];
  string supportsindicesuint16_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [32];
  ostringstream local_208 [8];
  ostringstream oss_meshBufferId;
  string local_90 [8];
  string meshbufferid_prefix;
  XrSceneMeshMSFT local_60 [2];
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_40;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  string *psStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrSceneMeshMSFT *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  local_40 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents;
  contents_local._7_1_ = is_pointer;
  psStack_30 = type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrSceneMeshMSFT *)gen_dispatch_table;
  PointerToHexString<XrSceneMeshMSFT>(local_60);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  if ((contents_local._7_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)prefix,".");
  }
  else {
    std::__cxx11::string::operator+=((string *)prefix,"->");
  }
  std::__cxx11::string::string(local_90,(string *)prefix);
  std::__cxx11::string::operator+=(local_90,"meshBufferId");
  std::__cxx11::ostringstream::ostringstream(local_208);
  poVar2 = std::operator<<((ostream *)local_208,"0x");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
  std::ostream::operator<<(poVar2,*(ulong *)prefix_local);
  pvVar1 = local_40;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            (pvVar1,(char (*) [9])"uint64_t",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,local_228
            );
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::string(local_248,(string *)prefix);
  std::__cxx11::string::operator+=(local_248,"supportsIndicesUint16");
  std::__cxx11::ostringstream::ostringstream(local_3c0);
  poVar2 = std::operator<<((ostream *)local_3c0,"0x");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
  std::ostream::operator<<(poVar2,*(uint *)(prefix_local + 8));
  pvVar1 = local_40;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            (pvVar1,(char (*) [9])"XrBool32",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
             local_3e0);
  std::__cxx11::string::~string((string *)local_3e0);
  gen_dispatch_table_local._7_1_ = 1;
  std::__cxx11::ostringstream::~ostringstream(local_3c0);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::ostringstream::~ostringstream(local_208);
  std::__cxx11::string::~string(local_90);
  return (bool)(gen_dispatch_table_local._7_1_ & 1);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSceneMeshMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string meshbufferid_prefix = prefix;
        meshbufferid_prefix += "meshBufferId";
        std::ostringstream oss_meshBufferId;
        oss_meshBufferId << "0x" << std::hex << (value->meshBufferId);
        contents.emplace_back("uint64_t", meshbufferid_prefix, oss_meshBufferId.str());
        std::string supportsindicesuint16_prefix = prefix;
        supportsindicesuint16_prefix += "supportsIndicesUint16";
        std::ostringstream oss_supportsIndicesUint16;
        oss_supportsIndicesUint16 << "0x" << std::hex << (value->supportsIndicesUint16);
        contents.emplace_back("XrBool32", supportsindicesuint16_prefix, oss_supportsIndicesUint16.str());
        return true;
    } catch(...) {
    }
    return false;
}